

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators_test.cpp
# Opt level: O0

void CheckSceneAverage(string *filename,float expected)

{
  WrapMode2D wrapMode;
  undefined1 uVar1;
  bool bVar2;
  ImageAndMetadata *pIVar3;
  ImageAndMetadata *this;
  Point2i PVar4;
  int *piVar5;
  Tuple2<pbrt::Point2,_int> message;
  undefined8 in_RDI;
  Float FVar6;
  AssertionResult gtest_ar_1;
  int nPixels;
  int c;
  int s;
  int t;
  Image *image;
  float sum;
  float delta;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_;
  optional<pbrt::ImageAndMetadata> im;
  ImageAndMetadata *in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa24;
  int iVar7;
  int *in_stack_fffffffffffffa28;
  WrapMode2D *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  ImageAndMetadata *in_stack_fffffffffffffa40;
  int *in_stack_fffffffffffffa48;
  Type type;
  undefined4 in_stack_fffffffffffffa50;
  int in_stack_fffffffffffffa54;
  char *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  char *in_stack_fffffffffffffa90;
  undefined6 in_stack_fffffffffffffa98;
  undefined1 uVar8;
  undefined4 uVar9;
  WrapMode WVar10;
  undefined1 *puVar11;
  AssertionResult local_538;
  Tuple2<pbrt::Point2,_int> local_528;
  Tuple2<pbrt::Point2,_int> local_520;
  int local_518;
  int local_504;
  Tuple2<pbrt::Point2,_int> in_stack_fffffffffffffb00;
  int in_stack_fffffffffffffb08;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ImageAndMetadata *pIVar16;
  float fVar17;
  undefined4 uVar18;
  char *in_stack_fffffffffffffb28;
  AssertionResult local_4c0;
  uint local_4ac;
  string local_4a8 [48];
  AssertionResult local_478 [2];
  undefined1 local_458 [16];
  undefined1 local_448 [536];
  optional local_230 [560];
  
  uVar9 = (undefined4)in_RDI;
  WVar10 = (WrapMode)((ulong)in_RDI >> 0x20);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  puVar11 = local_458;
  pbrt::ColorEncodingHandle::TaggedPointer
            ((ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
             in_stack_fffffffffffffa18);
  iVar7 = (int)local_448;
  pbrt::Image::Read((string *)im.optionalValue._264_8_,(Allocator)im.optionalValue._272_8_,
                    (ColorEncodingHandle *)im.optionalValue._256_8_);
  pstd::optional<pbrt::ImageAndMetadata>::optional
            ((optional<pbrt::ImageAndMetadata> *)
             CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),in_stack_fffffffffffffa18
            );
  pbrt::ImageAndMetadata::~ImageAndMetadata
            ((ImageAndMetadata *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  uVar1 = pstd::optional::operator_cast_to_bool(local_230);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
             SUB81((ulong)in_stack_fffffffffffffa18 >> 0x38,0));
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_478);
  uVar8 = bVar2;
  if (!bVar2) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar1,CONCAT16(uVar8,in_stack_fffffffffffffa98)),
               in_stack_fffffffffffffa90,
               (char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               in_stack_fffffffffffffa80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
               (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),(char *)in_stack_fffffffffffffa40,
               in_stack_fffffffffffffa3c,(char *)in_stack_fffffffffffffa30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(WVar10,uVar9),
               (Message *)CONCAT17(uVar1,CONCAT16(uVar8,in_stack_fffffffffffffa98)));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    std::__cxx11::string::~string(local_4a8);
    testing::Message::~Message((Message *)0x57509a);
  }
  local_4ac = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x57512b);
  if (local_4ac == 0) {
    pIVar3 = pstd::optional<pbrt::ImageAndMetadata>::operator->
                       ((optional<pbrt::ImageAndMetadata> *)0x575149);
    pbrt::Image::NChannels((Image *)0x57515a);
    testing::internal::EqHelper<false>::Compare<int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
               (char *)in_stack_fffffffffffffa30,in_stack_fffffffffffffa28,
               (int *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4c0);
    if (!bVar2) {
      testing::Message::Message
                ((Message *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
      testing::AssertionResult::failure_message((AssertionResult *)0x57520c);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                 (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20),(char *)in_stack_fffffffffffffa40,
                 in_stack_fffffffffffffa3c,(char *)in_stack_fffffffffffffa30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(WVar10,uVar9),
                 (Message *)CONCAT17(uVar1,CONCAT16(uVar8,in_stack_fffffffffffffa98)));
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      testing::Message::~Message((Message *)0x575269);
    }
    local_4ac = (uint)!bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5752d7);
    if (local_4ac == 0) {
      uVar18 = 0x3ccccccd;
      fVar17 = 0.0;
      this = pstd::optional<pbrt::ImageAndMetadata>::operator->
                       ((optional<pbrt::ImageAndMetadata> *)0x57530b);
      iVar14 = 0;
      while( true ) {
        type = (Type)((ulong)in_stack_fffffffffffffa48 >> 0x20);
        iVar15 = iVar14;
        PVar4 = pbrt::Image::Resolution(&this->image);
        iVar12 = PVar4.super_Tuple2<pbrt::Point2,_int>.x;
        iVar13 = PVar4.super_Tuple2<pbrt::Point2,_int>.y;
        piVar5 = pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                           ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffb0c,1);
        if (*piVar5 <= iVar14) break;
        in_stack_fffffffffffffa54 = 0;
        while( true ) {
          in_stack_fffffffffffffb08 = in_stack_fffffffffffffa54;
          in_stack_fffffffffffffb00 =
               (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&this->image);
          in_stack_fffffffffffffa48 =
               pbrt::Tuple2<pbrt::Point2,_int>::operator[]
                         ((Tuple2<pbrt::Point2,_int> *)&stack0xfffffffffffffb00,0);
          if (*in_stack_fffffffffffffa48 <= in_stack_fffffffffffffa54) break;
          for (local_504 = 0; local_504 < 3; local_504 = local_504 + 1) {
            pIVar16 = this;
            pbrt::Point2<int>::Point2
                      ((Point2<int> *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
                       (int)((ulong)in_stack_fffffffffffffa18 >> 0x20),
                       (int)in_stack_fffffffffffffa18);
            in_stack_fffffffffffffa3c = local_504;
            pbrt::WrapMode2D::WrapMode2D
                      (in_stack_fffffffffffffa30,
                       (WrapMode)((ulong)in_stack_fffffffffffffa28 >> 0x20));
            PVar4.super_Tuple2<pbrt::Point2,_int>.y = iVar7;
            PVar4.super_Tuple2<pbrt::Point2,_int>.x = (int)((ulong)puVar11 >> 0x20);
            wrapMode.wrap.values[1] = (WrapMode)puVar11;
            wrapMode.wrap.values[0] = WVar10;
            FVar6 = pbrt::Image::GetChannel
                              ((Image *)CONCAT17(uVar1,CONCAT16(uVar8,in_stack_fffffffffffffa98)),
                               PVar4,(int)((ulong)pIVar3 >> 0x20),wrapMode);
            fVar17 = FVar6 + fVar17;
            in_stack_fffffffffffffa40 = this;
            this = pIVar16;
          }
          in_stack_fffffffffffffa54 = in_stack_fffffffffffffb08 + 1;
        }
        iVar14 = iVar15 + 1;
      }
      message = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&this->image);
      local_520.x = message.x;
      iVar7 = local_520.x;
      local_520 = message;
      local_528 = (Tuple2<pbrt::Point2,_int>)pbrt::Image::Resolution(&this->image);
      local_518 = iVar7 * local_528.y * 3;
      testing::internal::DoubleNearPredFormat
                (in_stack_fffffffffffffb28,(char *)CONCAT44(uVar18,fVar17),(char *)this,
                 (double)CONCAT44(iVar15,iVar13),(double)CONCAT44(iVar12,in_stack_fffffffffffffb08),
                 (double)in_stack_fffffffffffffb00);
      bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_538);
      uVar18 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffa20);
      if (!bVar2) {
        testing::Message::Message
                  ((Message *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50));
        testing::AssertionResult::failure_message((AssertionResult *)0x5755ec);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
                   type,(char *)in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,(char *)message)
        ;
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)CONCAT44(WVar10,uVar9),
                   (Message *)CONCAT17(uVar1,CONCAT16(uVar8,in_stack_fffffffffffffa98)));
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)CONCAT44(iVar7,uVar18));
        testing::Message::~Message((Message *)0x575647);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x57569c);
      local_4ac = 0;
    }
  }
  pstd::optional<pbrt::ImageAndMetadata>::~optional((optional<pbrt::ImageAndMetadata> *)0x5756b4);
  return;
}

Assistant:

void CheckSceneAverage(const std::string &filename, float expected) {
    pstd::optional<ImageAndMetadata> im = Image::Read(filename);
    ASSERT_TRUE((bool)im);
    ASSERT_EQ(im->image.NChannels(), 3);

    float delta = .025;
    float sum = 0;

    Image &image = im->image;
    for (int t = 0; t < image.Resolution()[1]; ++t)
        for (int s = 0; s < image.Resolution()[0]; ++s)
            for (int c = 0; c < 3; ++c)
                sum += image.GetChannel(Point2i(s, t), c);
    int nPixels = image.Resolution().x * image.Resolution().y * 3;
    EXPECT_NEAR(expected, sum / nPixels, delta);
}